

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

QString * itemSubtypeToUString(QString *__return_storage_ptr__,UINT8 type,UINT8 subtype)

{
  undefined7 in_register_00000031;
  char *ch;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 0x3d:
    switch(subtype) {
    case 'd':
      ch = "Aptio signed";
      break;
    case 'e':
      ch = "Aptio unsigned";
      break;
    case 'f':
      ch = "UEFI 2.0";
      break;
    case 'g':
      ch = "Toshiba";
      break;
    default:
      goto switchD_001487ba_caseD_44;
    }
    break;
  case 0x3e:
    if (subtype == '[') {
      ch = "UEFI";
      break;
    }
    if (subtype != 'Z') goto switchD_001487ba_caseD_44;
    goto switchD_001489cb_caseD_90;
  case 0x3f:
    regionTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case 0x40:
    if (subtype == 'z') {
      ch = "Non-empty";
    }
    else if (subtype == 'y') {
      ch = "Empty (0xFF)";
    }
    else {
      if (subtype != 'x') goto switchD_001487ba_caseD_44;
      ch = "Empty (0x00)";
    }
    break;
  case 0x41:
    switch(subtype) {
    case 'n':
switchD_00148829_caseD_a1:
      ch = "Unknown";
      break;
    case 'o':
      ch = "FFSv2";
      break;
    case 'p':
      ch = "FFSv3";
      break;
    case 'q':
      ch = "NVRAM";
      break;
    case 'r':
      ch = "Microcode";
      break;
    default:
      goto switchD_001487ba_caseD_44;
    }
    break;
  case 0x42:
    fileTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case 0x43:
    sectionTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  default:
switchD_001487ba_caseD_44:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  case 0x4f:
    switch(subtype) {
    case 0x82:
      goto switchD_00148829_caseD_a0;
    case 0x83:
      ch = "Invalid link";
      break;
    case 0x84:
      ch = "Link";
      break;
    case 0x85:
      goto switchD_00148829_caseD_a4;
    case 0x86:
      ch = "Full";
      break;
    default:
      goto switchD_001487ba_caseD_44;
    }
    break;
  case 0x50:
    switch(subtype) {
    case 0x8c:
      goto switchD_00148829_caseD_a0;
    case 0x8d:
      ch = "Standard";
      break;
    case 0x8e:
      ch = "Apple";
      break;
    case 0x8f:
      ch = "Auth";
      break;
    case 0x90:
      goto switchD_001489cb_caseD_90;
    default:
      goto switchD_001487ba_caseD_44;
    }
    break;
  case 0x51:
    if (subtype == 0x97) {
      ch = "Normal";
      break;
    }
    if (subtype != 0x96) goto switchD_001487ba_caseD_44;
    goto switchD_00148829_caseD_a0;
  case 0x52:
    switch(subtype) {
    case 0xa0:
      goto switchD_00148829_caseD_a0;
    case 0xa1:
      goto switchD_00148829_caseD_a1;
    case 0xa2:
      ch = "GUID";
      break;
    case 0xa3:
      ch = "Name";
      break;
    case 0xa4:
      goto switchD_00148829_caseD_a4;
    default:
      goto switchD_001487ba_caseD_44;
    }
    break;
  case 0x53:
    if (subtype == 0xac) goto switchD_00148829_caseD_a1;
    if (subtype != 0xab) {
      if (subtype == 0xaa) {
        ch = "Volume";
        break;
      }
      goto switchD_001487ba_caseD_44;
    }
    goto switchD_00148829_caseD_a4;
  case 0x55:
    if (subtype == 0xb5) {
      ch = "AMD";
      break;
    }
    if (subtype != 0xb4) goto switchD_001487ba_caseD_44;
switchD_001489cb_caseD_90:
    ch = "Intel";
    break;
  case 0x58:
    if (subtype != 200) {
      if (subtype != 0xc9) goto switchD_001487ba_caseD_44;
      ch = "Boot";
      break;
    }
    goto switchD_00148829_caseD_a4;
  case 0x5a:
    if (subtype != 0xd3) {
      if (subtype != 0xd2) goto switchD_001487ba_caseD_44;
      ch = "Valid";
      break;
    }
switchD_00148829_caseD_a0:
    ch = "Invalid";
    break;
  case 0x5b:
    if (subtype == 0xde) {
      ch = "GLUT";
      break;
    }
    if (subtype != 0xdd) {
      if (subtype != 0xdc) goto switchD_001487ba_caseD_44;
      goto switchD_00148a05_caseD_e9;
    }
switchD_00148829_caseD_a4:
    ch = "Data";
    break;
  case 0x61:
    switch(subtype) {
    case 0xe6:
      ch = "Manifest";
      break;
    case 0xe7:
      ch = "Metadata";
      break;
    case 0xe8:
      ch = "Key";
      break;
    case 0xe9:
switchD_00148a05_caseD_e9:
      ch = "Code";
      break;
    default:
      goto switchD_001487ba_caseD_44;
    }
    break;
  case 100:
    if (subtype != 0xf0) goto switchD_001487ba_caseD_44;
    ch = "X86 128K";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

UString itemSubtypeToUString(const UINT8 type, const UINT8 subtype)
{
    switch (type) {
        case Types::Image:
            if      (subtype == Subtypes::IntelImage)                   return UString("Intel");
            else if (subtype == Subtypes::UefiImage)                    return UString("UEFI");
            break;
        case Types::Padding:
            if      (subtype == Subtypes::ZeroPadding)                  return UString("Empty (0x00)");
            else if (subtype == Subtypes::OnePadding)                   return UString("Empty (0xFF)");
            else if (subtype == Subtypes::DataPadding)                  return UString("Non-empty");
            break;
        case Types::Volume:
            if      (subtype == Subtypes::UnknownVolume)                return UString("Unknown");
            else if (subtype == Subtypes::Ffs2Volume)                   return UString("FFSv2");
            else if (subtype == Subtypes::Ffs3Volume)                   return UString("FFSv3");
            else if (subtype == Subtypes::NvramVolume)                  return UString("NVRAM");
            else if (subtype == Subtypes::MicrocodeVolume)              return UString("Microcode");
            break;
        case Types::Capsule:
            if      (subtype == Subtypes::AptioSignedCapsule)           return UString("Aptio signed");
            else if (subtype == Subtypes::AptioUnsignedCapsule)         return UString("Aptio unsigned");
            else if (subtype == Subtypes::UefiCapsule)                  return UString("UEFI 2.0");
            else if (subtype == Subtypes::ToshibaCapsule)               return UString("Toshiba");
            break;
        case Types::Region:                                             return regionTypeToUString(subtype);
        case Types::File:                                               return fileTypeToUString(subtype);
        case Types::Section:                                            return sectionTypeToUString(subtype);
        case Types::NvarEntry:
            if      (subtype == Subtypes::InvalidNvarEntry)             return UString("Invalid");
            else if (subtype == Subtypes::InvalidLinkNvarEntry)         return UString("Invalid link");
            else if (subtype == Subtypes::LinkNvarEntry)                return UString("Link");
            else if (subtype == Subtypes::DataNvarEntry)                return UString("Data");
            else if (subtype == Subtypes::FullNvarEntry)                return UString("Full");
            break;
        case Types::VssEntry:
            if      (subtype == Subtypes::InvalidVssEntry)              return UString("Invalid");
            else if (subtype == Subtypes::StandardVssEntry)             return UString("Standard");
            else if (subtype == Subtypes::AppleVssEntry)                return UString("Apple");
            else if (subtype == Subtypes::AuthVssEntry)                 return UString("Auth");
            else if (subtype == Subtypes::IntelVssEntry)                return UString("Intel");
            break;
        case Types::SysFEntry:
            if      (subtype == Subtypes::InvalidSysFEntry)             return UString("Invalid");
            else if (subtype == Subtypes::NormalSysFEntry)              return UString("Normal");
            break;
        case Types::EvsaEntry:
            if      (subtype == Subtypes::InvalidEvsaEntry)             return UString("Invalid");
            else if (subtype == Subtypes::UnknownEvsaEntry)             return UString("Unknown");
            else if (subtype == Subtypes::GuidEvsaEntry)                return UString("GUID");
            else if (subtype == Subtypes::NameEvsaEntry)                return UString("Name");
            else if (subtype == Subtypes::DataEvsaEntry)                return UString("Data");
            break;
        case Types::PhoenixFlashMapEntry:
            if      (subtype == Subtypes::VolumeFlashMapEntry)          return UString("Volume");
            else if (subtype == Subtypes::DataFlashMapEntry)            return UString("Data");
            else if (subtype == Subtypes::UnknownFlashMapEntry)         return UString("Unknown");
            break;
        case Types::Microcode:
            if      (subtype == Subtypes::IntelMicrocode)               return UString("Intel");
            else if (subtype == Subtypes::AmdMicrocode)                 return UString("AMD");
            break;
        case Types::FptEntry:
            if      (subtype == Subtypes::ValidFptEntry)                return UString("Valid");
            else if (subtype == Subtypes::InvalidFptEntry)              return UString("Invalid");
            break;
        case Types::FptPartition:
            if      (subtype == Subtypes::CodeFptPartition)             return UString("Code");
            else if (subtype == Subtypes::DataFptPartition)             return UString("Data");
            else if (subtype == Subtypes::GlutFptPartition)             return UString("GLUT");
            break;
        case Types::IfwiPartition:
            if      (subtype == Subtypes::BootIfwiPartition)            return UString("Boot");
            else if (subtype == Subtypes::DataIfwiPartition)            return UString("Data");
            break;
        case Types::CpdPartition:
            if      (subtype == Subtypes::ManifestCpdPartition)         return UString("Manifest");
            else if (subtype == Subtypes::MetadataCpdPartition)         return UString("Metadata");
            else if (subtype == Subtypes::KeyCpdPartition)              return UString("Key");
            else if (subtype == Subtypes::CodeCpdPartition)             return UString("Code");
            break;
        case Types::StartupApDataEntry:
            if      (subtype == Subtypes::x86128kStartupApDataEntry)    return UString("X86 128K");
            break;
    }
    
    return UString();
}